

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall
compiler::CompilerAstWalker::onEnterBreakStatementAstNode
          (CompilerAstWalker *this,BreakStatementAstNode *param_1)

{
  element_type *peVar1;
  pointer puVar2;
  pointer puVar3;
  reference pvVar4;
  iterator iVar5;
  value_type_conflict3 local_68;
  size_t breakIndex;
  size_t loopIndex;
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  local_50;
  undefined1 auStack_38 [8];
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> vec;
  
  peVar1 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar2 = (peVar1->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (peVar1->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&loopIndex,
             "onEnterBreakStatementAstNode encountered break statement but loopStartIndices empty",
             (allocator<char> *)auStack_38);
  Error::assertWithPanic(puVar2 != puVar3,(string *)&loopIndex);
  std::__cxx11::string::~string((string *)&loopIndex);
  peVar1 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_68 = (long)(peVar1->byteCode).
                   super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar1->byteCode).
                   super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&peVar1->loopStartIndices,
                      ((long)(peVar1->loopStartIndices).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(peVar1->loopStartIndices).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) - 1);
  breakIndex = *pvVar4;
  iVar5 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(((this->ec).
                    super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->breakStatementsForLoops)._M_h,&breakIndex);
  auStack_38 = (undefined1  [8])0x0;
  vec.
  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  if (iVar5.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::make_shared<std::vector<unsigned_long,std::allocator<unsigned_long>>>();
    std::
    __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)auStack_38,
                (__shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)&loopIndex);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50);
    peVar1 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    loopIndex = breakIndex;
    std::
    __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_50,
                   (__shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)auStack_38);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<unsigned_long,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&peVar1->breakStatementsForLoops,&loopIndex);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  else {
    std::
    __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)auStack_38,
                (__shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)((long)iVar5.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
                          ._M_cur + 0x10));
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_38,&local_68);
  emit(this,Jump);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&vec);
  return;
}

Assistant:

void onEnterBreakStatementAstNode(BreakStatementAstNode*  /*node*/) noexcept override {
    Error::assertWithPanic(!this->ec->loopStartIndices.empty(),
      "onEnterBreakStatementAstNode encountered break statement but loopStartIndices empty");

    std::size_t breakIndex = this->ec->byteCode.size();
    std::size_t loopIndex = this->ec->loopStartIndices.at(this->ec->loopStartIndices.size() - 1);

    auto find = this->ec->breakStatementsForLoops.find(loopIndex);

    std::shared_ptr<std::vector<std::size_t>> vec = nullptr;

    if (find == this->ec->breakStatementsForLoops.end()) {
      vec = std::make_shared<std::vector<std::size_t>>();
      this->ec->breakStatementsForLoops.insert(std::make_pair(loopIndex, vec));
    } else {
      vec = find->second;
    }

    vec->push_back(breakIndex);

    this->emit(bytecode::ByteCodeInstruction::Jump);
  }